

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O1

void Cipher::translate(TClusterToLetterMap *clMap,TClusters *clusters,
                      vector<int,_std::allocator<int>_> *plain)

{
  iterator __position;
  mapped_type *__args;
  pointer piVar1;
  long lVar2;
  long lVar3;
  
  piVar1 = (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  piVar1 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if (0 < (int)((ulong)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1) >> 2)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      __args = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                         (clMap,(key_type *)((long)piVar1 + lVar2));
      __position._M_current =
           (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (__position._M_current ==
          (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)plain,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      lVar3 = lVar3 + 1;
      piVar1 = (clusters->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 4;
    } while (lVar3 < (int)((ulong)((long)(clusters->super__Vector_base<int,_std::allocator<int>_>).
                                         _M_impl.super__Vector_impl_data._M_finish - (long)piVar1)
                          >> 2));
  }
  return;
}

Assistant:

void translate(
            const TClusterToLetterMap & clMap,
            const TClusters & clusters,
            std::vector<TLetter> & plain) {
        plain.clear();
        for (int i = 0; i < (int) clusters.size(); ++i) {
            plain.push_back(clMap.at(clusters[i]));
        }
    }